

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstract.h
# Opt level: O0

ostream * covenant::operator<<(ostream *o,AbstractMethod abs)

{
  string *msg;
  int in_ESI;
  ostream *in_RDI;
  allocator *this;
  allocator local_31;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  if (in_ESI == 0) {
    std::operator<<(in_RDI,"sigma-star");
  }
  else {
    if (in_ESI != 1) {
      msg = (string *)__cxa_allocate_exception(0x20);
      this = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"invalid abstraction method",this);
      error::error((error *)this,msg);
      __cxa_throw(msg,&error::typeinfo,error::~error);
    }
    std::operator<<(in_RDI,"cycle-breaking");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, AbstractMethod abs)
{
    if (abs == SIGMA_STAR)
      o << "sigma-star";
    else if (abs == CYCLE_BREAKING)
      o << "cycle-breaking";
    else throw error("invalid abstraction method");
    return o;
}